

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O1

void OPNPrescaler_w(FM_OPN *OPN,int addr,int pre_divider)

{
  UINT8 *pUVar1;
  ulong uVar2;
  int pres;
  
  if (addr < 0x2e) {
    if (addr == 0) {
      (OPN->ST).prescaler_sel = '\x02';
    }
    else if (addr == 0x2d) {
      pUVar1 = &(OPN->ST).prescaler_sel;
      *pUVar1 = *pUVar1 | 2;
    }
  }
  else if (addr == 0x2e) {
    pUVar1 = &(OPN->ST).prescaler_sel;
    *pUVar1 = *pUVar1 | 1;
  }
  else if (addr == 0x2f) {
    (OPN->ST).prescaler_sel = '\0';
  }
  uVar2 = (ulong)(((OPN->ST).prescaler_sel & 3) << 2);
  pres = *(int *)((long)OPNPrescaler_w::opn_pres + uVar2) * pre_divider;
  OPNSetPres(OPN,pres,pres,pre_divider * *(int *)((long)OPNPrescaler_w::ssg_pres + uVar2));
  return;
}

Assistant:

static void OPNPrescaler_w(FM_OPN *OPN , int addr, int pre_divider)
{
	static const int opn_pres[4] = { 2*12 , 2*12 , 6*12 , 3*12 };
	static const int ssg_pres[4] = { 1    ,    1 ,    4 ,    2 };
	int sel;

	switch(addr)
	{
	case 0:     /* when reset */
		OPN->ST.prescaler_sel = 2;
		break;
	case 1:     /* when postload */
		break;
	case 0x2d:  /* divider sel : select 1/1 for 1/3line    */
		OPN->ST.prescaler_sel |= 0x02;
		break;
	case 0x2e:  /* divider sel , select 1/3line for output */
		OPN->ST.prescaler_sel |= 0x01;
		break;
	case 0x2f:  /* divider sel , clear both selector to 1/2,1/2 */
		OPN->ST.prescaler_sel = 0;
		break;
	}
	sel = OPN->ST.prescaler_sel & 3;
	/* update prescaler */
	OPNSetPres( OPN,	opn_pres[sel]*pre_divider,
						opn_pres[sel]*pre_divider,
						ssg_pres[sel]*pre_divider );
}